

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v11::detail::format_handler<char>::on_format_specs
          (format_handler<char> *this,int id,char *begin,char *end)

{
  format_specs *pfVar1;
  undefined8 uVar2;
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 x [16];
  undefined1 x_00 [16];
  basic_string_view<char> s;
  write_int_arg<unsigned_long> arg_00;
  write_int_arg<unsigned_long> arg_01;
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  format_specs specs_00;
  format_specs specs_01;
  format_specs specs_02;
  appender out;
  appender out_00;
  appender out_01;
  appender out_02;
  appender out_03;
  appender out_04;
  loc_value value_03;
  loc_value value_04;
  loc_value value_05;
  loc_value value_06;
  loc_value value_07;
  loc_value value_08;
  handle hVar3;
  write_int_arg<unsigned___int128> arg_02;
  write_int_arg<unsigned___int128> arg_03;
  custom_value<fmt::v11::context> custom;
  bool bVar4;
  type tVar5;
  size_t *psVar6;
  basic_appender<char> bVar7;
  format_specs *in_RCX;
  parse_context<char> *ppVar8;
  buffer<char> *siglen;
  basic_appender<char> in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uchar *extraout_RDX_05;
  uchar *extraout_RDX_06;
  uchar *extraout_RDX_07;
  uchar *extraout_RDX_08;
  undefined8 extraout_RDX_09;
  uchar *extraout_RDX_10;
  uchar *extraout_RDX_11;
  uchar *puVar9;
  undefined4 in_ESI;
  format_specs *pfVar10;
  long in_RDI;
  locale_ref loc;
  uchar *tbs;
  size_t in_R9;
  dynamic_format_specs<char> specs;
  basic_format_arg<fmt::v11::context> arg;
  undefined4 in_stack_fffffffffffff7b8;
  uint in_stack_fffffffffffff7bc;
  undefined2 in_stack_fffffffffffff7c0;
  undefined6 in_stack_fffffffffffff7c2;
  parse_context<char> *in_stack_fffffffffffff7c8;
  locale_ref in_stack_fffffffffffff7d0;
  basic_appender<char> in_stack_fffffffffffff7d8;
  format_specs *in_stack_fffffffffffff7e0;
  arg_formatter<char> *this_00;
  write_int_arg<unsigned_int> in_stack_fffffffffffff7e8;
  basic_appender<char> in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 uVar11;
  sign in_stack_fffffffffffff7fc;
  sign sVar12;
  basic_appender<char> in_stack_fffffffffffff800;
  basic_appender<char> in_stack_fffffffffffff808;
  format_specs *in_stack_fffffffffffff810;
  undefined8 in_stack_fffffffffffff818;
  undefined1 value_09;
  locale_ref in_stack_fffffffffffff820;
  basic_appender<char> in_stack_fffffffffffff828;
  locale_ref in_stack_fffffffffffff830;
  undefined2 in_stack_fffffffffffff838;
  undefined2 in_stack_fffffffffffff83a;
  char in_stack_fffffffffffff83c [4];
  char *in_stack_fffffffffffff840;
  char *in_stack_fffffffffffff848;
  arg_formatter<char> local_790;
  buffer<char> local_778;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_748;
  undefined4 local_738;
  undefined4 in_stack_fffffffffffff8e8;
  iterator local_708;
  undefined8 in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  undefined8 in_stack_fffffffffffff910;
  void *in_stack_fffffffffffff918;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_6e0;
  undefined8 in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  parse_context<char> *in_stack_fffffffffffff9f8;
  parse_context<char> *local_2a8;
  size_t *local_238;
  void *local_230;
  size_t *local_1c8;
  void *local_1c0;
  size_t *local_128;
  buffer<char> *local_68;
  
  value_09 = (undefined1)((ulong)in_stack_fffffffffffff818 >> 0x38);
  get_arg<fmt::v11::context,int>
            ((context *)in_stack_fffffffffffff7d0.locale_,
             (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20));
  bVar4 = basic_format_arg<fmt::v11::context>::format_custom
                    ((basic_format_arg<fmt::v11::context> *)in_stack_fffffffffffff7d8.container,
                     (char_type *)in_stack_fffffffffffff7d0.locale_,in_stack_fffffffffffff7c8,
                     (context *)CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0));
  if (bVar4) {
    local_708 = parse_context<char>::begin((parse_context<char> *)0xa75775);
  }
  else {
    memset(&local_778,0,0x30);
    dynamic_format_specs<char>::dynamic_format_specs
              ((dynamic_format_specs<char> *)
               CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0));
    tVar5 = basic_format_arg<fmt::v11::context>::type
                      ((basic_format_arg<fmt::v11::context> *)&local_748.string);
    tbs = (uchar *)(ulong)tVar5;
    local_708 = parse_format_specs<char>
                          (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                           (dynamic_format_specs<char> *)
                           CONCAT44(in_stack_fffffffffffff83c,
                                    CONCAT22(in_stack_fffffffffffff83a,in_stack_fffffffffffff838)),
                           (parse_context<char> *)in_stack_fffffffffffff830.locale_,
                           (type)((ulong)in_stack_fffffffffffff828.container >> 0x20));
    bVar4 = basic_specs::dynamic((basic_specs *)&local_778);
    if (bVar4) {
      basic_specs::dynamic_width((basic_specs *)&local_778);
      handle_dynamic_spec<fmt::v11::context>
                ((arg_id_kind)((ulong)in_stack_fffffffffffff7d0.locale_ >> 0x20),
                 (int *)in_stack_fffffffffffff7c8,
                 (arg_ref<char> *)CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0),
                 (context *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      basic_specs::dynamic_precision((basic_specs *)&local_778);
      handle_dynamic_spec<fmt::v11::context>
                ((arg_id_kind)((ulong)in_stack_fffffffffffff7d0.locale_ >> 0x20),
                 (int *)in_stack_fffffffffffff7c8,
                 (arg_ref<char> *)CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0),
                 (context *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
    }
    loc.locale_ = (void *)(in_RDI + 0x18);
    local_790.out.container = (buffer<char> *)v11::context::out((context *)loc.locale_);
    local_790.specs = (format_specs *)&local_778;
    local_790.locale = v11::context::locale(loc.locale_);
    pfVar1 = local_790.specs;
    this_00 = &local_790;
    switch(local_738) {
    case 0:
    default:
      monostate::monostate((monostate *)&stack0xfffffffffffff907);
      pfVar1 = this_00->specs;
      uVar2._0_4_ = pfVar1->width;
      uVar2._4_4_ = pfVar1->precision;
      write<char,fmt::v11::basic_appender<char>>
                ((this_00->out).container,pfVar1->super_basic_specs,uVar2,(this_00->locale).locale_)
      ;
      break;
    case 1:
      ppVar8 = (parse_context<char> *)(ulong)local_748.uint_value;
      bVar7.container = local_790.out.container;
      bVar4 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      puVar9 = extraout_RDX;
      if (bVar4) {
        ppVar8 = in_stack_fffffffffffff9f8;
        loc_value::loc_value<int,_0>
                  ((loc_value *)CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0),
                   in_stack_fffffffffffff7bc);
        out.container._4_4_ = in_ESI;
        out.container._0_4_ = in_stack_fffffffffffff8e8;
        value_03.value_.value_.field_0.string.size = in_stack_fffffffffffff908;
        value_03.value_.value_.field_0.long_long_value = in_stack_fffffffffffff900;
        value_03.value_._16_8_ = in_stack_fffffffffffff910;
        value_03.value_._24_8_ = in_stack_fffffffffffff918;
        bVar7.container = (buffer<char> *)pfVar1;
        in_stack_fffffffffffff7c8 = ppVar8;
        bVar4 = write_loc(out,value_03,in_RCX,(locale_ref)local_708);
        puVar9 = extraout_RDX_00;
        if (bVar4) {
          return local_708;
        }
      }
      basic_specs::sign(&pfVar1->super_basic_specs,(EVP_PKEY_CTX *)bVar7.container,puVar9,
                        (size_t *)ppVar8,tbs,in_R9);
      make_write_int_arg<int>
                ((int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),(sign)in_stack_fffffffffffff7c8);
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      break;
    case 2:
      ppVar8 = (parse_context<char> *)(ulong)local_748.uint_value;
      bVar7.container = local_790.out.container;
      bVar4 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      puVar9 = extraout_RDX_01;
      if (bVar4) {
        loc_value::loc_value<unsigned_int,_0>
                  ((loc_value *)CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0),
                   in_stack_fffffffffffff7bc);
        out_00.container._4_4_ = in_ESI;
        out_00.container._0_4_ = in_stack_fffffffffffff8e8;
        value_04.value_.value_.field_0.string.size = in_stack_fffffffffffff908;
        value_04.value_.value_.field_0.long_long_value = in_stack_fffffffffffff900;
        value_04.value_._16_8_ = in_stack_fffffffffffff910;
        value_04.value_._24_8_ = in_stack_fffffffffffff918;
        bVar7.container = (buffer<char> *)pfVar1;
        in_stack_fffffffffffff7c8 = local_2a8;
        bVar4 = write_loc(out_00,value_04,in_RCX,(locale_ref)local_708);
        ppVar8 = local_2a8;
        puVar9 = extraout_RDX_02;
        if (bVar4) {
          return local_708;
        }
      }
      basic_specs::sign(&pfVar1->super_basic_specs,(EVP_PKEY_CTX *)bVar7.container,puVar9,
                        (size_t *)ppVar8,tbs,in_R9);
      make_write_int_arg<unsigned_int>
                ((uint)((ulong)in_stack_fffffffffffff7c8 >> 0x20),(sign)in_stack_fffffffffffff7c8);
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      break;
    case 3:
      psVar6 = (size_t *)CONCAT44(local_748.long_long_value._4_4_,local_748.int_value);
      bVar7.container = local_790.out.container;
      bVar4 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      sVar12 = (sign)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
      puVar9 = extraout_RDX_03;
      if (bVar4) {
        loc_value::loc_value<long_long,_0>
                  ((loc_value *)CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0),
                   CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
        out_01.container._4_4_ = in_ESI;
        out_01.container._0_4_ = in_stack_fffffffffffff8e8;
        value_05.value_.value_.field_0.string.size = in_stack_fffffffffffff908;
        value_05.value_.value_.field_0.long_long_value = in_stack_fffffffffffff900;
        value_05.value_._16_8_ = in_stack_fffffffffffff910;
        value_05.value_._24_8_ = in_stack_fffffffffffff918;
        bVar7.container = (buffer<char> *)pfVar1;
        psVar6 = local_238;
        bVar4 = write_loc(out_01,value_05,in_RCX,(locale_ref)local_708);
        sVar12 = (sign)((ulong)psVar6 >> 0x20);
        psVar6 = local_238;
        puVar9 = extraout_RDX_04;
        in_stack_fffffffffffff7d0.locale_ = local_230;
        if (bVar4) {
          return local_708;
        }
      }
      basic_specs::sign(&pfVar1->super_basic_specs,(EVP_PKEY_CTX *)bVar7.container,puVar9,psVar6,tbs
                        ,in_R9);
      make_write_int_arg<long_long>((longlong)in_stack_fffffffffffff7d0.locale_,sVar12);
      arg_00.prefix = in_stack_fffffffffffff7f8;
      arg_00.abs_value = (unsigned_long)in_stack_fffffffffffff7f0.container;
      arg_00._12_4_ = in_stack_fffffffffffff7fc;
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
                (in_stack_fffffffffffff800,arg_00,(format_specs *)in_stack_fffffffffffff7e8);
      break;
    case 4:
      psVar6 = (size_t *)CONCAT44(local_748.long_long_value._4_4_,local_748.int_value);
      bVar7.container = local_790.out.container;
      bVar4 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      sVar12 = (sign)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
      puVar9 = extraout_RDX_05;
      if (bVar4) {
        loc_value::loc_value<unsigned_long_long,_0>
                  ((loc_value *)CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0),
                   CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
        out_02.container._4_4_ = in_ESI;
        out_02.container._0_4_ = in_stack_fffffffffffff8e8;
        value_06.value_.value_.field_0.string.size = in_stack_fffffffffffff908;
        value_06.value_.value_.field_0.long_long_value = in_stack_fffffffffffff900;
        value_06.value_._16_8_ = in_stack_fffffffffffff910;
        value_06.value_._24_8_ = in_stack_fffffffffffff918;
        bVar7.container = (buffer<char> *)pfVar1;
        psVar6 = local_1c8;
        bVar4 = write_loc(out_02,value_06,in_RCX,(locale_ref)local_708);
        sVar12 = (sign)((ulong)psVar6 >> 0x20);
        psVar6 = local_1c8;
        puVar9 = extraout_RDX_06;
        in_stack_fffffffffffff7d0.locale_ = local_1c0;
        if (bVar4) {
          return local_708;
        }
      }
      basic_specs::sign(&pfVar1->super_basic_specs,(EVP_PKEY_CTX *)bVar7.container,puVar9,psVar6,tbs
                        ,in_R9);
      make_write_int_arg<unsigned_long_long>
                ((unsigned_long_long)in_stack_fffffffffffff7d0.locale_,sVar12);
      arg_01.prefix = in_stack_fffffffffffff7f8;
      arg_01.abs_value = (unsigned_long)in_stack_fffffffffffff7f0.container;
      arg_01._12_4_ = in_stack_fffffffffffff7fc;
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
                (in_stack_fffffffffffff800,arg_01,(format_specs *)in_stack_fffffffffffff7e8);
      break;
    case 5:
      x._4_4_ = in_stack_fffffffffffff7bc;
      x._0_4_ = in_stack_fffffffffffff7b8;
      x._8_2_ = in_stack_fffffffffffff7c0;
      x._10_6_ = in_stack_fffffffffffff7c2;
      psVar6 = (size_t *)
               detail::map((int128_opt *)
                           CONCAT44(local_748.long_long_value._4_4_,local_748.int_value),
                           (int128_opt)x);
      pfVar1 = this_00->specs;
      pfVar10 = (format_specs *)(this_00->locale).locale_;
      bVar4 = basic_specs::localized(&pfVar1->super_basic_specs);
      puVar9 = extraout_RDX_07;
      if (bVar4) {
        value._8_4_ = in_stack_fffffffffffff7b8;
        value._0_8_ = 0xa76195;
        value._12_4_ = in_stack_fffffffffffff7bc;
        loc_value::loc_value<__int128,_0>((loc_value *)in_stack_fffffffffffff7c8,(__int128)value);
        out_03.container._4_4_ = in_ESI;
        out_03.container._0_4_ = in_stack_fffffffffffff8e8;
        value_07.value_.value_.field_0.string.size = in_stack_fffffffffffff908;
        value_07.value_.value_.field_0.long_long_value = in_stack_fffffffffffff900;
        value_07.value_._16_8_ = in_stack_fffffffffffff910;
        value_07.value_._24_8_ = in_stack_fffffffffffff918;
        pfVar10 = pfVar1;
        bVar4 = write_loc(out_03,value_07,in_RCX,(locale_ref)local_708);
        psVar6 = local_128;
        puVar9 = extraout_RDX_08;
        if (bVar4) {
          return local_708;
        }
      }
      basic_specs::sign(&pfVar1->super_basic_specs,(EVP_PKEY_CTX *)pfVar10,puVar9,psVar6,tbs,in_R9);
      value_01._8_8_ = in_stack_fffffffffffff808.container;
      value_01._0_8_ = in_stack_fffffffffffff800.container;
      make_write_int_arg<__int128>((__int128)value_01,in_stack_fffffffffffff7fc);
      arg_02.abs_value._8_8_ = in_stack_fffffffffffff9e8;
      arg_02.abs_value._0_8_ = in_stack_fffffffffffff9e0;
      arg_02._16_8_ = in_stack_fffffffffffff9f0;
      arg_02._24_8_ = in_stack_fffffffffffff9f8;
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
                (in_stack_fffffffffffff800,arg_02,
                 (format_specs *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      break;
    case 6:
      x_00._4_4_ = in_stack_fffffffffffff7bc;
      x_00._0_4_ = in_stack_fffffffffffff7b8;
      x_00._8_2_ = in_stack_fffffffffffff7c0;
      x_00._10_6_ = in_stack_fffffffffffff7c2;
      bVar7.container =
           (buffer<char> *)
           detail::map((uint128_opt *)CONCAT44(local_748.long_long_value._4_4_,local_748.int_value),
                       (uint128_opt)x_00);
      pfVar1 = this_00->specs;
      pfVar10 = (format_specs *)(this_00->locale).locale_;
      siglen = bVar7.container;
      bVar4 = basic_specs::localized(&pfVar1->super_basic_specs);
      puVar9 = extraout_RDX_10;
      if (bVar4) {
        value_00._8_4_ = in_stack_fffffffffffff7b8;
        value_00._0_8_ = 0xa764a5;
        value_00._12_4_ = in_stack_fffffffffffff7bc;
        loc_value::loc_value<unsigned___int128,_0>
                  ((loc_value *)in_stack_fffffffffffff7c8,(unsigned___int128)value_00);
        out_04.container._4_4_ = in_ESI;
        out_04.container._0_4_ = in_stack_fffffffffffff8e8;
        value_08.value_.value_.field_0.string.size = in_stack_fffffffffffff908;
        value_08.value_.value_.field_0.long_long_value = in_stack_fffffffffffff900;
        value_08.value_._16_8_ = in_stack_fffffffffffff910;
        value_08.value_._24_8_ = in_stack_fffffffffffff918;
        pfVar10 = pfVar1;
        bVar4 = write_loc(out_04,value_08,in_RCX,(locale_ref)local_708);
        siglen = local_68;
        puVar9 = extraout_RDX_11;
        if (bVar4) {
          return local_708;
        }
      }
      uVar11 = (undefined4)extraout_RDX_09;
      sVar12 = (sign)((ulong)extraout_RDX_09 >> 0x20);
      basic_specs::sign(&pfVar1->super_basic_specs,(EVP_PKEY_CTX *)pfVar10,puVar9,(size_t *)siglen,
                        tbs,in_R9);
      value_02._8_8_ = this_00;
      value_02._0_8_ = bVar7.container;
      write_int_arg<std::
      conditional<(((num_bits<unsigned__int128>)())<=(32))&&(!(0)),unsigned_int,std::
      conditional<((num_bits<unsigned__int128>)())<=(64),unsigned_long,unsigned__int128>::type>::
      type>fmt::v11::detail::make_write_int_arg<unsigned__int128>
                ((unsigned___int128)value_02,sVar12);
      arg_03.abs_value._8_8_ = in_stack_fffffffffffff9e8;
      arg_03.abs_value._0_8_ = in_stack_fffffffffffff9e0;
      arg_03._16_8_ = in_stack_fffffffffffff9f0;
      arg_03._24_8_ = in_stack_fffffffffffff9f8;
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
                (bVar7,arg_03,(format_specs *)CONCAT44(sVar12,uVar11));
      break;
    case 7:
      write<char,_fmt::v11::basic_appender<char>,_bool,_0>
                (in_stack_fffffffffffff828,(bool)value_09,in_stack_fffffffffffff810,
                 in_stack_fffffffffffff820);
      break;
    case 8:
      write<char,fmt::v11::basic_appender<char>>
                (in_stack_fffffffffffff808,(char)(in_stack_fffffffffffff7fc >> 0x18),
                 (format_specs *)in_stack_fffffffffffff7f0.container,
                 (locale_ref)in_stack_fffffffffffff800.container);
      break;
    case 9:
      specs_00.super_basic_specs.data_._2_2_ = in_stack_fffffffffffff83a;
      specs_00.super_basic_specs.data_._0_2_ = in_stack_fffffffffffff838;
      specs_00.super_basic_specs.fill_data_[0] = in_stack_fffffffffffff83c[0];
      specs_00.super_basic_specs.fill_data_[1] = in_stack_fffffffffffff83c[1];
      specs_00.super_basic_specs.fill_data_[2] = in_stack_fffffffffffff83c[2];
      specs_00.super_basic_specs.fill_data_[3] = in_stack_fffffffffffff83c[3];
      specs_00._8_8_ = loc.locale_;
      write<char,_fmt::v11::basic_appender<char>,_float,_0>
                ((buffer<char> *)&local_748,
                 (float)((ulong)in_stack_fffffffffffff828.container >> 0x20),specs_00,
                 in_stack_fffffffffffff830);
      break;
    case 10:
      specs_01.super_basic_specs.data_._2_2_ = in_stack_fffffffffffff83a;
      specs_01.super_basic_specs.data_._0_2_ = in_stack_fffffffffffff838;
      specs_01.super_basic_specs.fill_data_[0] = in_stack_fffffffffffff83c[0];
      specs_01.super_basic_specs.fill_data_[1] = in_stack_fffffffffffff83c[1];
      specs_01.super_basic_specs.fill_data_[2] = in_stack_fffffffffffff83c[2];
      specs_01.super_basic_specs.fill_data_[3] = in_stack_fffffffffffff83c[3];
      specs_01._8_8_ = loc.locale_;
      write<char,_fmt::v11::basic_appender<char>,_double,_0>
                ((buffer<char> *)&local_748,(double)in_stack_fffffffffffff828.container,specs_01,
                 in_stack_fffffffffffff830);
      break;
    case 0xb:
      specs_02.width = local_738;
      specs_02.super_basic_specs = (basic_specs)&local_748;
      specs_02.precision = 0;
      write<char,_fmt::v11::basic_appender<char>,_long_double,_0>
                (in_RDX,(longdouble)
                        CONCAT28(in_stack_fffffffffffff838,in_stack_fffffffffffff830.locale_),
                 specs_02,loc);
      break;
    case 0xc:
      bVar7.container._4_4_ = in_stack_fffffffffffff7fc;
      bVar7.container._0_4_ = in_stack_fffffffffffff7f8;
      write<char,fmt::v11::basic_appender<char>>
                (bVar7,(char *)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                 (locale_ref)in_stack_fffffffffffff7f0.container);
      break;
    case 0xd:
      string_value<char>::str((string_value<char> *)0xa7691e);
      s.size_ = (size_t)in_stack_fffffffffffff7e0;
      s.data_ = (char *)in_stack_fffffffffffff7d8.container;
      write<char,fmt::v11::basic_appender<char>>
                ((basic_appender<char>)in_stack_fffffffffffff7e8,s,
                 (format_specs *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7d0);
      break;
    case 0xe:
      write<char,_fmt::v11::basic_appender<char>,_void,_0>
                (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7c8,
                 (format_specs *)CONCAT62(in_stack_fffffffffffff7c2,in_stack_fffffffffffff7c0),
                 in_stack_fffffffffffff7d0);
      break;
    case 0xf:
      custom.value._4_4_ = local_748.long_long_value._4_4_;
      custom.value._0_4_ = local_748.int_value;
      custom.format._0_2_ = local_748.int128_value._8_2_;
      custom.format._2_6_ = local_748.int128_value._10_6_;
      basic_format_arg<fmt::v11::context>::handle::handle((handle *)&stack0xfffffffffffff918,custom)
      ;
      hVar3.custom_.format = local_6e0;
      hVar3.custom_.value = in_stack_fffffffffffff918;
      arg_formatter<char>::operator()(this_00,hVar3);
    }
  }
  return local_708;
}

Assistant:

auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    auto arg = get_arg(ctx, id);
    // Not using a visitor for custom types gives better codegen.
    if (arg.format_custom(begin, parse_ctx, ctx)) return parse_ctx.begin();

    auto specs = dynamic_format_specs<Char>();
    begin = parse_format_specs(begin, end, specs, parse_ctx, arg.type());
    if (specs.dynamic()) {
      handle_dynamic_spec(specs.dynamic_width(), specs.width, specs.width_ref,
                          ctx);
      handle_dynamic_spec(specs.dynamic_precision(), specs.precision,
                          specs.precision_ref, ctx);
    }

    arg.visit(arg_formatter<Char>{ctx.out(), specs, ctx.locale()});
    return begin;
  }